

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::Update(cmCTestVC *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte local_100;
  byte local_fe;
  byte local_fc;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string_view local_88;
  undefined4 local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string versionOverride;
  bool result;
  cmCTestVC *this_local;
  
  versionOverride.field_2._M_local_buf[0xf] = '\x01';
  pcVar1 = this->CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"UpdateVersionOverride",&local_61);
  cmCTest::GetCTestConfiguration((string *)local_40,pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    (*this->_vptr_cmCTestVC[6])(this,local_40);
    this_local._7_1_ = true;
  }
  else {
    pcVar1 = this->CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"UpdateVersionOnly",&local_c9);
    cmCTest::GetCTestConfiguration(&local_a8,pcVar1,&local_c8);
    local_88 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
    bVar2 = cmIsOn(local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      uVar3 = (*this->_vptr_cmCTestVC[3])();
      local_fc = 0;
      if ((uVar3 & 1) != 0) {
        local_fc = versionOverride.field_2._M_local_buf[0xf];
      }
      versionOverride.field_2._M_local_buf[0xf] = local_fc & 1;
      std::operator<<(this->Log,"--- Begin Update ---\n");
      uVar3 = (*this->_vptr_cmCTestVC[4])();
      local_fe = 0;
      if ((uVar3 & 1) != 0) {
        local_fe = versionOverride.field_2._M_local_buf[0xf];
      }
      versionOverride.field_2._M_local_buf[0xf] = local_fe & 1;
      std::operator<<(this->Log,"--- End Update ---\n");
    }
    uVar3 = (*this->_vptr_cmCTestVC[5])();
    local_100 = 0;
    if ((uVar3 & 1) != 0) {
      local_100 = versionOverride.field_2._M_local_buf[0xf];
    }
    versionOverride.field_2._M_local_buf[0xf] = local_100 & 1;
    this_local._7_1_ = (bool)versionOverride.field_2._M_local_buf[0xf];
  }
  local_78 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmCTestVC::Update()
{
  bool result = true;

  // Use the explicitly specified version.
  std::string versionOverride =
    this->CTest->GetCTestConfiguration("UpdateVersionOverride");
  if (!versionOverride.empty()) {
    this->SetNewRevision(versionOverride);
    return true;
  }

  // if update version only is on then do not actually update,
  // just note the current version and finish
  if (!cmIsOn(this->CTest->GetCTestConfiguration("UpdateVersionOnly"))) {
    result = this->NoteOldRevision() && result;
    this->Log << "--- Begin Update ---\n";
    result = this->UpdateImpl() && result;
    this->Log << "--- End Update ---\n";
  }
  result = this->NoteNewRevision() && result;
  return result;
}